

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O1

void vm_init(Vm *vm,_Bool interactive)

{
  uint32_t index;
  CallFrame *frame;
  HashTable strings;
  HashTable local_30;
  
  vm->sp = vm->stack;
  vm->first_object = (Object *)0x0;
  vm->allocated_mem = 0;
  vm->max_alloc_mem = 0x100000;
  vm->frame_count = 0;
  vm->interactive = interactive;
  vm->err_flag = false;
  vm->current_status = VM_STATUS_INIT;
  (vm->frames).count = 0;
  (vm->frames).cap = 0;
  (vm->frames).frame_pointers = (CallFrame **)0x0;
  frame = new_call_frame();
  index = vm->frame_count;
  vm->frame_count = index + 1;
  frames_write_at(&vm->frames,index,frame);
  ht_init(&local_30,HT_KEY_IDENT_STRING,0x10,free_string_literal);
  (vm->strings).free_callback = local_30.free_callback;
  (vm->strings).buckets = local_30.buckets;
  (vm->strings).key_type = local_30.key_type;
  (vm->strings).cap = local_30.cap;
  (vm->strings).size = local_30.size;
  *(undefined4 *)&(vm->strings).field_0xc = local_30._12_4_;
  return;
}

Assistant:

void vm_init(Vm *vm, bool interactive) {
    vm->sp = vm->stack;
    vm->first_object = NULL;
    vm->allocated_mem = 0;
    vm->max_alloc_mem = INITIAL_GC_THRESHOLD;
    vm->frame_count = 0;
    vm->interactive = interactive;
    vm->err_flag = false;
    vm->current_status = VM_STATUS_INIT;

    FrameArray frames;
    frames_init(&frames);
    vm->frames = frames;

    CallFrame *call_frame = new_call_frame();
    frames_write_at(&vm->frames, vm->frame_count++, call_frame);

    HashTable strings;
    ht_init(&strings, HT_KEY_IDENT_STRING, 16, free_string_literal);
    vm->strings = strings;
}